

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall H264StreamReader::calcPicOrder(H264StreamReader *this,SliceUnit *slice)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  if (slice->sps->pic_order_cnt_type != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"SPS picture order ",0x12);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," not supported.",0xf);
    puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar5 = 0x12e;
    *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
    if (local_1b0 == &local_1a0) {
      puVar5[6] = local_1a0;
      puVar5[7] = uStack_19c;
      puVar5[8] = uStack_198;
      puVar5[9] = uStack_194;
    }
    else {
      *(uint **)(puVar5 + 2) = local_1b0;
      *(ulong *)(puVar5 + 6) = CONCAT44(uStack_19c,local_1a0);
    }
    *(undefined8 *)(puVar5 + 4) = local_1a8;
    local_1a0 = local_1a0 & 0xffffff00;
    __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  bVar2 = SliceUnit::isIDR(slice);
  if (bVar2) {
    this->prevPicOrderCntMsb = 0;
    this->prevPicOrderCntLsb = 0;
    uVar8 = (uint)slice->pic_order_cnt_lsb;
    iVar3 = 1 << ((byte)slice->sps->log2_max_pic_order_cnt_lsb & 0x1f);
    iVar6 = 0;
  }
  else {
    iVar3 = 1 << ((byte)slice->sps->log2_max_pic_order_cnt_lsb & 0x1f);
    iVar6 = this->prevPicOrderCntLsb;
    uVar1 = slice->pic_order_cnt_lsb;
    uVar8 = (uint)uVar1;
    if (((int)(uint)uVar1 < iVar6) && (iVar3 / 2 <= (int)(iVar6 - (uint)uVar1))) {
      iVar3 = iVar3 + this->prevPicOrderCntMsb;
      goto LAB_00186bf5;
    }
  }
  if ((iVar6 < (int)uVar8) && (iVar3 / 2 < (int)(uVar8 - iVar6))) {
    iVar3 = this->prevPicOrderCntMsb - iVar3;
  }
  else {
    iVar3 = this->prevPicOrderCntMsb;
  }
LAB_00186bf5:
  if (slice->memory_management_control_operation == 5) {
    this->prevPicOrderCntMsb = 0;
    uVar7 = iVar3 + uVar8;
    if (slice->bottom_field_flag != 0) {
      uVar7 = 0;
    }
  }
  else {
    this->prevPicOrderCntMsb = iVar3;
    uVar7 = uVar8;
  }
  this->prevPicOrderCntLsb = uVar7;
  return (int)(iVar3 + uVar8) >> ((byte)this->m_forceLsbDiv & 0x1f);
}

Assistant:

int H264StreamReader::calcPicOrder(const SliceUnit &slice)
{
    if (slice.getSPS()->pic_order_cnt_type != 0)
        THROW(ERR_H264_UNSUPPORTED_PARAMETER,
              "SPS picture order " << slice.getSPS()->pic_order_cnt_type << " not supported.")

    if (slice.isIDR())
        prevPicOrderCntMsb = prevPicOrderCntLsb = 0;

    const int PicOrderCntLsb = slice.pic_order_cnt_lsb;
    const int MaxPicOrderCntLsb = 1 << slice.getSPS()->log2_max_pic_order_cnt_lsb;
    int PicOrderCntMsb;

    if ((PicOrderCntLsb < prevPicOrderCntLsb) && ((prevPicOrderCntLsb - PicOrderCntLsb) >= (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb + MaxPicOrderCntLsb;
    else if ((PicOrderCntLsb > prevPicOrderCntLsb) && ((PicOrderCntLsb - prevPicOrderCntLsb) > (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb - MaxPicOrderCntLsb;
    else
        PicOrderCntMsb = prevPicOrderCntMsb;

    if (slice.memory_management_control_operation == 5)
    {
        prevPicOrderCntMsb = 0;
        if (!slice.bottom_field_flag)
            prevPicOrderCntLsb = PicOrderCntMsb + PicOrderCntLsb;
        else
            prevPicOrderCntLsb = 0;
    }
    else
    {
        prevPicOrderCntMsb = PicOrderCntMsb;
        prevPicOrderCntLsb = PicOrderCntLsb;
    }
    return (PicOrderCntMsb + PicOrderCntLsb) >> m_forceLsbDiv;
}